

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validators.hpp
# Opt level: O2

void __thiscall CLI::Validator::Validator(Validator *this,string *validator_desc)

{
  string local_30 [32];
  
  ::std::__cxx11::string::string(local_30,(string *)validator_desc);
  ::std::function<std::__cxx11::string()>::
  function<CLI::Validator::Validator(std::__cxx11::string)::_lambda()_1_,void>
            ((function<std::__cxx11::string()> *)this,(anon_class_32_1_5ff8519c *)local_30);
  ::std::__cxx11::string::~string(local_30);
  *(undefined8 *)&(this->func_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->func_).super__Function_base._M_functor + 8) = 0;
  (this->func_)._M_invoker =
       std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_CLI::Validator::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dkubek[P]NPRG041-image_match/extern/CLI11/CLI/Validators.hpp:84:53)>
       ::_M_invoke;
  (this->func_).super__Function_base._M_manager =
       std::
       _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_CLI::Validator::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dkubek[P]NPRG041-image_match/extern/CLI11/CLI/Validators.hpp:84:53)>
       ::_M_manager;
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  (this->name_)._M_string_length = 0;
  (this->name_).field_2._M_local_buf[0] = '\0';
  this->application_index_ = -1;
  this->active_ = true;
  this->non_modifying_ = false;
  return;
}

Assistant:

explicit Validator(std::string validator_desc) : desc_function_([validator_desc]() { return validator_desc; }) {}